

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

bool __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::request_slot(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
               *this,size_type slot,
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  __type _Var1;
  uint uVar2;
  int in_R8D;
  undefined4 in_register_00000084;
  uint uVar3;
  uint uVar4;
  GlobalPtr<int> GVar5;
  GlobalPtr<int> ptr;
  GlobalPtr<int> ptr_00;
  int xor_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  HME entry;
  
  uVar4 = 0;
  do {
    uVar3 = uVar4;
    GVar5 = slot_used_ptr(this,slot);
    ptr.ptr._0_4_ = uVar3;
    ptr.rank = GVar5.ptr;
    ptr.ptr._4_4_ = 0;
    uVar2 = int_compare_and_swap((BCL *)GVar5.rank,ptr,1,in_R8D);
    uVar4 = uVar3;
    if ((uVar2 & 3) != 0) {
      uVar4 = 2;
    }
  } while (uVar3 != uVar2);
  _Var1 = true;
  if (uVar3 != 0) {
    get_entry(&entry,this,slot);
    Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
    ::get(&local_70,&entry.key);
    _Var1 = std::operator==(&local_70,key);
    std::__cxx11::string::~string((string *)&local_70);
    if (!_Var1) {
      xor_value = 3;
      GVar5 = slot_used_ptr(this,slot);
      local_70._M_dataplus._M_p = xor_<int>::vtable + 0x28;
      local_70._M_string_length = 0x10ea48;
      local_70.field_2._M_allocated_capacity = 0x10ea80;
      ptr_00.ptr = (size_t)&xor_value;
      ptr_00.rank = GVar5.ptr;
      fetch_and_op<int>((BCL *)GVar5.rank,ptr_00,(int *)local_70.field_2._M_local_buf,
                        (atomic_op<int> *)CONCAT44(in_register_00000084,in_R8D));
    }
  }
  return _Var1;
}

Assistant:

bool request_slot(size_type slot, const Key& key) {
    bool success = false;
    int current_value = free_flag;
    int return_value;

    do {
      return_value = BCL::int_compare_and_swap(slot_used_ptr(slot),
                                               current_value, reserved_flag);
      if (current_value == return_value) {
        success = true;
      }

      if (return_value & ready_flag || return_value & reserved_flag) {
        current_value = ready_flag;
      }
    } while (!success);

    // At this point, you have slot -> reserved_flag

    if (return_value & ready_flag) {
      HME entry = get_entry(slot);
      if (entry.get_key() == key) {
        return true;
      } else {
        int xor_value = 0x3;
        BCL::fetch_and_op<int>(slot_used_ptr(slot), xor_value, BCL::xor_<int>{});
        return false;
      }
    } else {
      return true;
    }
  }